

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void struct_suite::fail_invalid_first(void)

{
  person value;
  value_type input [8];
  iarchive in;
  allocator<char> local_118 [32];
  person local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  char local_c0 [8];
  undefined8 uStack_b8;
  uchar local_b0 [8];
  iarchive local_a8;
  
  local_b0[0] = 0x90;
  local_b0[1] = 0xa9;
  local_b0[2] = '\x03';
  local_b0[3] = 'A';
  local_b0[4] = 'B';
  local_b0[5] = 'C';
  local_b0[6] = 0x81;
  local_b0[7] = 0x91;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[8]>(&local_a8,&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",local_118);
  local_f8.name._M_string_length = local_c8;
  local_f8.name._M_dataplus._M_p = (pointer)&local_f8.name.field_2;
  if (local_d0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0) {
    local_f8.name.field_2._8_8_ = uStack_b8;
  }
  else {
    local_f8.name._M_dataplus._M_p = (pointer)local_d0;
  }
  local_c8 = 0;
  local_c0[0] = '\0';
  local_f8.age = 99;
  local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c0;
  std::__cxx11::string::~string((string *)&local_d0);
  boost::archive::detail::load_non_pointer_type<trial::protocol::bintoken::iarchive>::load_standard
  ::invoke<struct_suite::person>(&local_a8,&local_f8);
  boost::detail::throw_failed_impl
            ("in >> value","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x2a5,"void struct_suite::fail_invalid_first()");
  std::__cxx11::string::~string((string *)&local_f8);
  trial::protocol::bintoken::iarchive::~iarchive(&local_a8);
  return;
}

Assistant:

void fail_invalid_first()
{
    const value_type input[] = { token::code::begin_record,
                                 token::code::string8, 0x03, 0x41, 0x42, 0x43,
                                 token::code::true_value,
                                 token::code::end_record };
    format::iarchive in(input);
    person value("", 99);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(in >> value,
                                    format::error, "invalid value");
}